

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushItemWidth(float item_width)

{
  int *piVar1;
  ImVector<float> *pIVar2;
  ImGuiNextItemData *pIVar3;
  ImGuiWindow *pIVar4;
  float *pfVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  float *__dest;
  int iVar8;
  int iVar9;
  ImGuiContext *ctx;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if ((item_width == 0.0) && (!NAN(item_width))) {
    item_width = pIVar4->ItemWidthDefault;
  }
  (pIVar4->DC).ItemWidth = item_width;
  iVar7 = (pIVar4->DC).ItemWidthStack.Size;
  if (iVar7 == (pIVar4->DC).ItemWidthStack.Capacity) {
    if (iVar7 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar7 / 2 + iVar7;
    }
    iVar9 = iVar7 + 1;
    if (iVar7 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (float *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
    pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
    if (pfVar5 != (float *)0x0) {
      memcpy(__dest,pfVar5,(long)(pIVar4->DC).ItemWidthStack.Size << 2);
      pfVar5 = (pIVar4->DC).ItemWidthStack.Data;
      if ((pfVar5 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pfVar5,GImAllocatorUserData);
    }
    (pIVar4->DC).ItemWidthStack.Data = __dest;
    (pIVar4->DC).ItemWidthStack.Capacity = iVar9;
    iVar7 = (pIVar4->DC).ItemWidthStack.Size;
    item_width = (pIVar4->DC).ItemWidth;
  }
  else {
    __dest = (pIVar4->DC).ItemWidthStack.Data;
  }
  __dest[iVar7] = item_width;
  pIVar2 = &(pIVar4->DC).ItemWidthStack;
  pIVar2->Size = pIVar2->Size + 1;
  pIVar3 = &pIVar6->NextItemData;
  *(byte *)&pIVar3->Flags = (byte)pIVar3->Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushItemWidth(float item_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.ItemWidth = (item_width == 0.0f ? window->ItemWidthDefault : item_width);
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}